

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:289:11)>
::destroy(SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:289:11)>
          *this)

{
  SimpleTransformPromiseNode<kj::AuthenticatedStream,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:289:11)>
  *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<kj::AuthenticatedStream,kj::(anonymous_namespace)::TestCase249::run()::__6>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }